

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O0

void GEN_CS::gen_cs_example_dr<true>(cb_to_cs_adf *c,multi_ex *examples,label *cs_labels)

{
  undefined4 uVar1;
  bool bVar2;
  size_type sVar3;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  long in_RDI;
  example *unaff_retaddr;
  cb_class *in_stack_00000008;
  single_learner *in_stack_00000010;
  int known_index;
  wclass wc;
  size_t i;
  wclass *in_stack_ffffffffffffffa8;
  example *in_stack_ffffffffffffffb0;
  ulong local_20;
  
  v_array<COST_SENSITIVE::wclass>::clear
            ((v_array<COST_SENSITIVE::wclass> *)in_stack_ffffffffffffffb0);
  v_array<COST_SENSITIVE::wclass>::clear
            ((v_array<COST_SENSITIVE::wclass> *)in_stack_ffffffffffffffb0);
  for (local_20 = 0; sVar3 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI),
      local_20 < sVar3; local_20 = local_20 + 1) {
    std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,local_20);
    bVar2 = CB_ALGS::example_is_newline_not_header(in_stack_ffffffffffffffb0);
    if (!bVar2) {
      if (*(uint *)(in_RDI + 0x5c) == local_20) {
        uVar1 = *(undefined4 *)(in_RDI + 0x5c);
        *(undefined4 *)(in_RDI + 0x5c) = 0;
        in_stack_ffffffffffffffb0 = *(example **)(in_RDI + 0x68);
        std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,local_20);
        CB_ALGS::get_cost_pred<true>
                  (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                   (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
        *(undefined4 *)(in_RDI + 0x5c) = uVar1;
      }
      else {
        in_stack_ffffffffffffffa8 = *(wclass **)(in_RDI + 0x68);
        std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,local_20);
        CB_ALGS::get_cost_pred<true>
                  (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                   (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
      }
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8);
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8);
    }
  }
  return;
}

Assistant:

void gen_cs_example_dr(cb_to_cs_adf& c, multi_ex& examples, COST_SENSITIVE::label& cs_labels)
{  // size_t mysize = examples.size();
  c.pred_scores.costs.clear();
  
  cs_labels.costs.clear();
  for (size_t i = 0; i < examples.size(); i++)
  {
    if (CB_ALGS::example_is_newline_not_header(*examples[i]))
      continue;

    COST_SENSITIVE::wclass wc = {0., (uint32_t)i, 0., 0.};

    if (c.known_cost.action == i)
    {
      int known_index = c.known_cost.action;
      c.known_cost.action = 0;
      // get cost prediction for this label
      // num_actions should be 1 effectively.
      // my get_cost_pred function will use 1 for 'index-1+base'
      wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, &(c.known_cost), *(examples[i]), 0, 2);
      c.known_cost.action = known_index;
    }
    else
      wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, nullptr, *(examples[i]), 0, 2);

    c.pred_scores.costs.push_back(wc);  // done

    // add correction if we observed cost for this action and regressor is wrong
    if (c.known_cost.probability != -1 && c.known_cost.action == i)
      wc.x += (c.known_cost.cost - wc.x) / c.known_cost.probability;
    cs_labels.costs.push_back(wc);
  }
}